

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.h
# Opt level: O1

void __thiscall Liby::WeakTimerHolder::~WeakTimerHolder(WeakTimerHolder *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Manager_type p_Var3;
  int iVar4;
  BasicHandler *pBVar5;
  
  p_Var2 = (this->weakTimerPtr_).super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
    }
  }
  p_Var3 = (this->timer_).handler_.super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    pBVar5 = &(this->timer_).handler_;
    (*p_Var3)((_Any_data *)pBVar5,(_Any_data *)pBVar5,__destroy_functor);
  }
  return;
}

Assistant:

WeakTimerHolder() = default;